

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

void __thiscall
icu_63::Formattable::populateDecimalQuantity
          (Formattable *this,DecimalQuantity *output,UErrorCode *status)

{
  Type TVar1;
  
  if (this->fDecimalQuantity != (DecimalQuantity *)0x0) {
    icu_63::number::impl::DecimalQuantity::operator=(output,this->fDecimalQuantity);
    return;
  }
  TVar1 = this->fType;
  if (TVar1 == kInt64) {
    icu_63::number::impl::DecimalQuantity::setToLong(output,(this->fValue).fInt64);
    return;
  }
  if (TVar1 == kLong) {
    icu_63::number::impl::DecimalQuantity::setToInt(output,*(int32_t *)&this->fValue);
    return;
  }
  if (TVar1 == kDouble) {
    icu_63::number::impl::DecimalQuantity::setToDouble(output,(this->fValue).fDouble);
    icu_63::number::impl::DecimalQuantity::roundToInfinity(output);
    return;
  }
  *status = U_INVALID_STATE_ERROR;
  return;
}

Assistant:

void
Formattable::populateDecimalQuantity(number::impl::DecimalQuantity& output, UErrorCode& status) const {
    if (fDecimalQuantity != nullptr) {
        output = *fDecimalQuantity;
        return;
    }

    switch (fType) {
        case kDouble:
            output.setToDouble(this->getDouble());
            output.roundToInfinity();
            break;
        case kLong:
            output.setToInt(this->getLong());
            break;
        case kInt64:
            output.setToLong(this->getInt64());
            break;
        default:
            // The formattable's value is not a numeric type.
            status = U_INVALID_STATE_ERROR;
    }
}